

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

GLuint __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::getProgramResourceIndex
          (FunctionalTest3_4 *this,GLuint program_id,GLenum program_interface,GLchar *resource_name)

{
  ostringstream *this_00;
  int iVar1;
  GLuint GVar2;
  deUint32 err;
  undefined4 extraout_var;
  GLchar *pGVar3;
  undefined1 local_1a8 [384];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  GVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x9a8))
                    (program_id,program_interface,resource_name);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"getProgramResourceIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xc7a);
  if (GVar2 == 0xffffffff) {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Error. Program resource is not available. ");
    std::operator<<((ostream *)this_00,"Program interface: ");
    pGVar3 = Utils::programInterfaceToStr(program_interface);
    std::operator<<((ostream *)this_00,pGVar3);
    std::operator<<((ostream *)this_00,". ");
    std::operator<<((ostream *)this_00,"Resource name: ");
    std::operator<<((ostream *)this_00,resource_name);
    std::operator<<((ostream *)this_00,".");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return GVar2;
}

Assistant:

GLuint FunctionalTest3_4::getProgramResourceIndex(GLuint program_id, GLenum program_interface,
												  const glw::GLchar* resource_name) const
{
	const glw::Functions& gl	= m_context.getRenderContext().getFunctions();
	GLuint				  index = gl.getProgramResourceIndex(program_id, program_interface, resource_name);

	GLU_EXPECT_NO_ERROR(gl.getError(), "getProgramResourceIndex");

	if (GL_INVALID_INDEX == index)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Program resource is not available. "
											<< "Program interface: " << Utils::programInterfaceToStr(program_interface)
											<< ". "
											<< "Resource name: " << resource_name << "." << tcu::TestLog::EndMessage;
	}

	return index;
}